

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O3

void __thiscall
TPZFrontNonSym<float>::ExtractFrontMatrix(TPZFrontNonSym<float> *this,TPZFMatrix<float> *front)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  lVar2 = (this->super_TPZFront<float>).fLocal.fNElements;
  lVar8 = (this->super_TPZFront<float>).fNextRigidBodyMode;
  if (lVar8 < lVar2) {
    do {
      iVar6 = Local(this,lVar8);
      (this->super_TPZFront<float>).fData.fStore
      [(long)(this->super_TPZFront<float>).fMaxFront * (long)iVar6 + (long)iVar6] = 1.0;
      lVar8 = lVar8 + 1;
    } while (lVar2 != lVar8);
  }
  if (lVar2 < 1) {
    lVar8 = 0;
  }
  else {
    lVar9 = 0;
    do {
      lVar8 = lVar9;
      if ((this->super_TPZFront<float>).fLocal.fStore[lVar9] != -1) break;
      lVar9 = lVar9 + 1;
      lVar8 = lVar2;
    } while (lVar2 != lVar9);
  }
  (*(front->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (front,lVar2 - lVar8);
  if (lVar8 < lVar2) {
    lVar9 = lVar8;
    do {
      if (((this->super_TPZFront<float>).fLocal.fStore[lVar9] != -1) && (0 < lVar2)) {
        lVar7 = lVar9 - lVar8;
        lVar10 = 0;
        do {
          plVar3 = (this->super_TPZFront<float>).fLocal.fStore;
          lVar4 = plVar3[lVar10];
          if (lVar4 != -1) {
            lVar1 = lVar10 - lVar8;
            lVar5 = (front->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
            if (((lVar5 <= lVar7 || lVar7 < 0) || (lVar1 < 0)) ||
               ((front->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol <= lVar1)) {
              TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            front->fElem[lVar5 * lVar1 + lVar7] =
                 (this->super_TPZFront<float>).fData.fStore
                 [lVar4 * (this->super_TPZFront<float>).fMaxFront + plVar3[lVar9]];
          }
          lVar10 = lVar10 + 1;
        } while (lVar2 != lVar10);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != lVar2);
  }
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::ExtractFrontMatrix(TPZFMatrix<TVar> &front)
{
	// Extend the front with the non initialized rigid body modes
	int64_t ieq;
	int64_t maxeq = this->fLocal.NElements();
	for (ieq = this->fNextRigidBodyMode; ieq< maxeq; ieq++) {
		int ilocal = Local(ieq);
		Element(ilocal, ilocal) = 1.;
	}
	
	int64_t mineq = 0;
	for(mineq=0; mineq<maxeq; mineq++) if(this->fLocal[mineq] != -1) break;
	int64_t numeq = maxeq-mineq;
	front.Redim(numeq,numeq);
	int64_t jeq;
	for(ieq=mineq;ieq<maxeq;ieq++) {
		if(this->fLocal[ieq] == -1) continue;
		int64_t il = ieq-mineq;
		for(jeq=0;jeq<maxeq;jeq++) {
			if(this->fLocal[jeq] == -1) continue;
			int64_t jl = jeq-mineq;
			front(il,jl) = this->Element(this->fLocal[ieq],this->fLocal[jeq]);
		}
	}
	
}